

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

int luaD_reallocstack(lua_State *L,int newsize,int raiseerror)

{
  lu_byte lVar1;
  int iVar2;
  StkId pSVar3;
  int oldgcstop;
  StkId newstack;
  int i;
  int oldsize;
  int raiseerror_local;
  int newsize_local;
  lua_State *L_local;
  
  iVar2 = (int)((long)(L->stack_last).p - (L->stack).offset >> 4);
  lVar1 = L->l_G->gcstopem;
  relstack(L);
  L->l_G->gcstopem = '\x01';
  pSVar3 = (StkId)luaM_realloc_(L,(L->stack).p,(long)(iVar2 + 5) << 4,(long)(newsize + 5) << 4);
  L->l_G->gcstopem = lVar1;
  if (pSVar3 == (StkId)0x0) {
    correctstack(L);
    if (raiseerror != 0) {
      luaD_throw(L,4);
    }
    L_local._4_4_ = 0;
  }
  else {
    (L->stack).p = pSVar3;
    correctstack(L);
    (L->stack_last).p = (L->stack).p + newsize;
    for (newstack._0_4_ = iVar2 + 5; (int)newstack < newsize + 5; newstack._0_4_ = (int)newstack + 1
        ) {
      (&pSVar3->val)[(int)newstack].tt_ = '\0';
    }
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

int luaD_reallocstack (lua_State *L, int newsize, int raiseerror) {
  int oldsize = stacksize(L);
  int i;
  StkId newstack;
  int oldgcstop = G(L)->gcstopem;
  lua_assert(newsize <= LUAI_MAXSTACK || newsize == ERRORSTACKSIZE);
  relstack(L);  /* change pointers to offsets */
  G(L)->gcstopem = 1;  /* stop emergency collection */
  newstack = luaM_reallocvector(L, L->stack.p, oldsize + EXTRA_STACK,
                                   newsize + EXTRA_STACK, StackValue);
  G(L)->gcstopem = oldgcstop;  /* restore emergency collection */
  if (l_unlikely(newstack == NULL)) {  /* reallocation failed? */
    correctstack(L);  /* change offsets back to pointers */
    if (raiseerror)
      luaM_error(L);
    else return 0;  /* do not raise an error */
  }
  L->stack.p = newstack;
  correctstack(L);  /* change offsets back to pointers */
  L->stack_last.p = L->stack.p + newsize;
  for (i = oldsize + EXTRA_STACK; i < newsize + EXTRA_STACK; i++)
    setnilvalue(s2v(newstack + i)); /* erase new segment */
  return 1;
}